

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O0

void __thiscall
Assimp::LoadRequest::LoadRequest
          (LoadRequest *this,string *_file,uint _flags,PropertyMap *_map,uint _id)

{
  uint _id_local;
  PropertyMap *_map_local;
  uint _flags_local;
  string *_file_local;
  LoadRequest *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)_file);
  this->flags = _flags;
  this->refCnt = 1;
  this->scene = (aiScene *)0x0;
  this->loaded = false;
  BatchLoader::PropertyMap::PropertyMap(&this->map);
  this->id = _id;
  if (_map != (PropertyMap *)0x0) {
    BatchLoader::PropertyMap::operator=(&this->map,_map);
  }
  return;
}

Assistant:

LoadRequest(const std::string& _file, unsigned int _flags,const BatchLoader::PropertyMap* _map, unsigned int _id)
        : file(_file)
        , flags(_flags)
        , refCnt(1)
        , scene(NULL)
        , loaded(false)
        , id(_id) {
            if ( _map ) {
                map = *_map;
            }
        }